

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

HitCounter * __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
get<char_const*,unsigned_long>
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,char **arg1
          ,unsigned_long arg2)

{
  Predicate __pred;
  bool bVar1;
  iterator __last;
  iterator iVar2;
  reference ppHVar3;
  LineNumber in_RDX;
  undefined8 *in_RSI;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  *in_RDI;
  bool bVar4;
  iterator iter;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *in_stack_ffffffffffffff98
  ;
  char *in_stack_ffffffffffffffc0;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  in_stack_ffffffffffffffd8;
  HitCounter *local_8;
  
  (*(code *)in_RDI->_M_current[0xb])();
  __last = std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::begin
                     (in_stack_ffffffffffffff98);
  (*(code *)in_RDI->_M_current[0xb])();
  iVar2 = std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end
                    (in_stack_ffffffffffffff98);
  HitCounter::Predicate::Predicate((Predicate *)&stack0xffffffffffffffb8,(char *)*in_RSI,in_RDX);
  __pred.m_lineNumber = (LineNumber)iVar2._M_current;
  __pred.m_filename = in_stack_ffffffffffffffc0;
  ::std::
  find_if<__gnu_cxx::__normal_iterator<el::base::HitCounter**,std::vector<el::base::HitCounter*,std::allocator<el::base::HitCounter*>>>,el::base::HitCounter::Predicate>
            (in_stack_ffffffffffffffd8,
             (__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              )__last._M_current,__pred);
  (*(code *)in_RDI->_M_current[0xb])();
  std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end
            (in_stack_ffffffffffffff98);
  bVar1 = __gnu_cxx::operator!=
                    (in_RDI,(__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                             *)in_stack_ffffffffffffff98);
  bVar4 = false;
  if (bVar1) {
    ppHVar3 = __gnu_cxx::
              __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ::operator*((__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                           *)&stack0xffffffffffffffd8);
    bVar4 = *ppHVar3 != (HitCounter *)0x0;
  }
  if (bVar4) {
    ppHVar3 = __gnu_cxx::
              __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ::operator*((__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                           *)&stack0xffffffffffffffd8);
    local_8 = *ppHVar3;
  }
  else {
    local_8 = (HitCounter *)0x0;
  }
  return local_8;
}

Assistant:

T_Ptr* get(const T& arg1, const T2 arg2) {
    iterator iter = std::find_if(this->list().begin(), this->list().end(), Pred(arg1, arg2));
    if (iter != this->list().end() && *iter != nullptr) {
      return *iter;
    }
    return nullptr;
  }